

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeThumbAddSPReg(MCInst *Inst,uint16_t Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 == 0xa81) {
    uVar1 = GPRDecoderTable[Insn >> 4 & 8 | Insn & 7];
    MCOperand_CreateReg0(Inst,(uint)uVar1);
    MCOperand_CreateReg0(Inst,0xc);
  }
  else {
    uVar2 = MCInst_getOpcode(Inst);
    if (uVar2 != 0xa85) {
      return MCDisassembler_Success;
    }
    MCOperand_CreateReg0(Inst,0xc);
    MCOperand_CreateReg0(Inst,0xc);
    uVar1 = GPRDecoderTable[Insn >> 3 & 0xf];
  }
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeThumbAddSPReg(MCInst *Inst, uint16_t Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (MCInst_getOpcode(Inst) == ARM_tADDrSP) {
		unsigned Rdm = fieldFromInstruction_2(Insn, 0, 3);
		Rdm |= fieldFromInstruction_2(Insn, 7, 1) << 3;

		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
	} else if (MCInst_getOpcode(Inst) == ARM_tADDspr) {
		unsigned Rm = fieldFromInstruction_2(Insn, 3, 4);

		MCOperand_CreateReg0(Inst, ARM_SP);
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}